

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Sprs_array_col_block_list(int s_a,int **idx,int *n)

{
  int *piVar1;
  long lVar2;
  Integer N;
  Integer *Idx;
  long local_30;
  Integer *local_28;
  
  pnga_sprs_array_col_block_list((long)s_a,&local_28,&local_30);
  *n = (int)local_30;
  piVar1 = (int *)malloc(local_30 * 4);
  *idx = piVar1;
  lVar2 = 0;
  if (local_30 < 1) {
    local_30 = lVar2;
  }
  for (; local_30 != lVar2; lVar2 = lVar2 + 1) {
    piVar1[lVar2] = (int)local_28[lVar2];
  }
  free(local_28);
  return;
}

Assistant:

void NGA_Sprs_array_col_block_list(int s_a, int **idx, int *n)
{
  Integer *Idx;
  Integer i,N;
  Integer sa = s_a;
  wnga_sprs_array_col_block_list(sa, &Idx, &N);
  *n = N;
  *idx = (int*)malloc(N*sizeof(int));
  for (i=0; i<N; i++) {
    (*idx)[i] = (int)(Idx[i]);
  }
  free(Idx);
}